

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::
     DefaultPrintTo<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
               (undefined8 param_1,long param_2,ostream *param_3)

{
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  
  std::operator<<(param_3,"{");
  p_Var1 = *(_Rb_tree_node_base **)(param_2 + 0x18);
  lVar2 = 0;
  do {
    if (p_Var1 == (_Rb_tree_node_base *)(param_2 + 8)) {
      if (lVar2 != 0) {
LAB_001dc063:
        std::operator<<(param_3," ");
      }
      std::operator<<(param_3,"}");
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(param_3,","), lVar2 == 0x20)) {
      std::operator<<(param_3," ...");
      goto LAB_001dc063;
    }
    std::operator<<(param_3," ");
    PrintTo<int_const,int>((pair<const_int,_int> *)(p_Var1 + 1),param_3);
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

inline void DefaultPrintTo(IsContainerHelper::yes_t
                        , iutest_type_traits::false_type
                        , const T& container, iu_ostream* os)
{
    const size_t kMaxCount = kValues::MaxPrintContainerCount;
    size_t count = 0;
    *os << "{";
    for( typename T::const_iterator it=container.begin(), end=container.end(); it != end; ++it, ++count)
    {
        if( count > 0 )
        {
            *os << ",";
            if( count == kMaxCount )
            {
                *os << " ...";
                break;
            }
        }
        *os << " ";
        UniversalPrint(*it, os);
    }
    if( count > 0 )
    {
        *os << " ";
    }
    *os << "}";
}